

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer_cmdhandler.cpp
# Opt level: O0

void __thiscall VGMPlayer::Cmd_DACCtrl_Stop(VGMPlayer *this)

{
  DACSTRM_DEV *pDVar1;
  reference pvVar2;
  DACSTRM_DEV *dacStrm;
  size_t dsID;
  DACSTRM_DEV *dacStrm_1;
  size_t curStrm;
  VGMPlayer *this_local;
  
  if (this->_fileData[(ulong)this->_filePos + 1] == 0xff) {
    for (dacStrm_1 = (DACSTRM_DEV *)0x0;
        pDVar1 = (DACSTRM_DEV *)
                 std::vector<VGMPlayer::DACSTRM_DEV,_std::allocator<VGMPlayer::DACSTRM_DEV>_>::size
                           (&this->_dacStreams), dacStrm_1 < pDVar1;
        dacStrm_1 = (DACSTRM_DEV *)((long)&(dacStrm_1->defInf).dataPtr + 1)) {
      pvVar2 = std::vector<VGMPlayer::DACSTRM_DEV,_std::allocator<VGMPlayer::DACSTRM_DEV>_>::
               operator[](&this->_dacStreams,(size_type)dacStrm_1);
      pvVar2->lastItem = 0xffffffff;
      daccontrol_stop((pvVar2->defInf).dataPtr);
    }
  }
  else if (this->_dacStrmMap[this->_fileData[(ulong)this->_filePos + 1]] != 0xffffffffffffffff) {
    pvVar2 = std::vector<VGMPlayer::DACSTRM_DEV,_std::allocator<VGMPlayer::DACSTRM_DEV>_>::
             operator[](&this->_dacStreams,
                        this->_dacStrmMap[this->_fileData[(ulong)this->_filePos + 1]]);
    pvVar2->lastItem = 0xffffffff;
    daccontrol_stop((pvVar2->defInf).dataPtr);
  }
  return;
}

Assistant:

void VGMPlayer::Cmd_DACCtrl_Stop(void)	// DAC Stream Control: Stop immediately
{
	if (fData[0x01] == 0xFF)
	{
		for (size_t curStrm = 0; curStrm < _dacStreams.size(); curStrm++)
		{
			DACSTRM_DEV* dacStrm = &_dacStreams[curStrm];
			dacStrm->lastItem = (UINT32)-1;
			daccontrol_stop(dacStrm->defInf.dataPtr);
		}
		return;
	}
	
	size_t dsID = _dacStrmMap[fData[0x01]];
	if (dsID == (size_t)-1)
		return;
	DACSTRM_DEV* dacStrm = &_dacStreams[dsID];
	
	dacStrm->lastItem = (UINT32)-1;
	daccontrol_stop(dacStrm->defInf.dataPtr);
	return;
}